

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<pybind11::object,pybind11::object>::load_impl_sequence<0ul,1ul>
          (argument_loader<pybind11::object,pybind11::object> *this,long call)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = pyobject_caster<pybind11::object>::load<pybind11::object,_0>
                    ((pyobject_caster<pybind11::object> *)(this + 8),
                     (PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = pyobject_caster<pybind11::object>::load<pybind11::object,_0>
                    ((pyobject_caster<pybind11::object> *)this,
                     *(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  return bVar2 && bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }